

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_low_entropy(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  uint64_t uVar8;
  
  piVar1 = strm->state;
  iVar4 = piVar1->bitp;
  if (iVar4 < 1) {
    sVar6 = strm->avail_in;
    iVar7 = iVar4;
    do {
      sVar6 = sVar6 - 1;
      if (sVar6 == 0xffffffffffffffff) {
        return 0;
      }
      strm->avail_in = sVar6;
      uVar5 = piVar1->acc << 8;
      piVar1->acc = uVar5;
      pbVar2 = strm->next_in;
      strm->next_in = pbVar2 + 1;
      uVar8 = *pbVar2 | uVar5;
      piVar1->acc = uVar8;
      iVar4 = iVar7 + 8;
      piVar1->bitp = iVar4;
      bVar3 = iVar7 < -7;
      iVar7 = iVar4;
    } while (bVar3);
  }
  else {
    uVar8 = piVar1->acc;
  }
  piVar1->id = (uint)((uVar8 >> ((ulong)(iVar4 - 1U) & 0x3f) & 1) != 0);
  piVar1->bitp = iVar4 - 1U;
  piVar1->mode = m_low_entropy_ref;
  return 1;
}

Assistant:

static int m_low_entropy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (bits_ask(strm, 1) == 0)
        return M_EXIT;
    state->id = bits_get(strm, 1);
    bits_drop(strm, 1);
    state->mode = m_low_entropy_ref;
    return M_CONTINUE;
}